

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlockSymbols.cpp
# Opt level: O1

void slang::ast::GenerateBlockSymbol::fromSyntax
               (Compilation *compilation,CaseGenerateSyntax *syntax,ASTContext *context,
               uint32_t constructIndex,bool isUninstantiated,
               SmallVectorBase<slang::ast::GenerateBlockSymbol_*> *results)

{
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *attributes;
  pointer ppCVar1;
  size_t sVar2;
  CaseItemSyntax *pCVar3;
  Expression *expr;
  Expression *expr_00;
  span<const_slang::syntax::ExpressionSyntax_*const,_18446744073709551615UL> expressions_00;
  SourceRange range;
  bool bVar4;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> pSVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> *ppSVar9;
  Diagnostic *pDVar10;
  pointer ppCVar11;
  SyntaxNode **ppSVar12;
  ulong uVar13;
  long lVar14;
  StandardCaseItemSyntax *sci;
  SourceRange sourceRange;
  SmallVector<const_slang::ast::Expression_*,_5UL> bound;
  ConstantValue condVal;
  SmallVector<const_slang::syntax::ExpressionSyntax_*,_5UL> expressions;
  ConstantValue val;
  Type *local_190;
  SourceLocation local_180;
  SourceLocation local_178;
  SyntaxNode *local_160;
  SourceLocation local_148;
  SourceLocation local_140;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> local_110;
  undefined8 local_108;
  undefined8 local_100;
  SyntaxNode local_f8;
  _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  local_d0;
  ExpressionSyntax *local_a8;
  pointer ppEStack_a0;
  ExpressionSyntax *local_98;
  pointer ppEStack_90;
  undefined8 local_88;
  ExpressionSyntax local_80;
  _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  local_58;
  
  local_98 = &local_80;
  ppEStack_90 = (pointer)0x0;
  local_88 = 5;
  sVar2 = (syntax->items).super_span<slang::syntax::CaseItemSyntax_*,_18446744073709551615UL>.
          _M_extent._M_extent_value;
  if (sVar2 == 0) {
    local_160 = (SyntaxNode *)0x0;
  }
  else {
    ppCVar11 = (syntax->items).super_span<slang::syntax::CaseItemSyntax_*,_18446744073709551615UL>.
               _M_ptr;
    ppCVar1 = ppCVar11 + sVar2;
    local_160 = (SyntaxNode *)0x0;
    do {
      pCVar3 = *ppCVar11;
      if ((pCVar3->super_SyntaxNode).kind == StandardCaseItem) {
        uVar13 = *(long *)&pCVar3[3].super_SyntaxNode + 1;
        if (1 < uVar13) {
          uVar13 = uVar13 >> 1;
          lVar14 = 0;
          do {
            ppSVar9 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                                ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                  *)((long)&(pCVar3[2].super_SyntaxNode.previewNode)->kind + lVar14)
                                );
            local_110 = *ppSVar9;
            SmallVectorBase<slang::syntax::ExpressionSyntax_const*>::
            emplace_back<slang::syntax::ExpressionSyntax_const*const&>
                      ((SmallVectorBase<slang::syntax::ExpressionSyntax_const*> *)&local_98,
                       (ExpressionSyntax **)&local_110);
            lVar14 = lVar14 + 0x30;
            uVar13 = uVar13 - 1;
          } while (uVar13 != 0);
        }
      }
      else {
        local_160 = pCVar3[2].super_SyntaxNode.parent;
      }
      ppCVar11 = ppCVar11 + 1;
    } while (ppCVar11 != ppCVar1);
  }
  local_110 = &local_f8;
  local_108 = 0;
  local_100 = 5;
  local_a8 = local_98;
  ppEStack_a0 = ppEStack_90;
  expressions_00._M_extent._M_extent_value = (size_t)&local_110;
  expressions_00._M_ptr = ppEStack_90;
  bVar6 = Expression::bindMembershipExpressions
                    ((Expression *)context,(ASTContext *)0x73,Unknown,false,true,true,
                     SUB81((syntax->condition).ptr,0),local_98,expressions_00,
                     (SmallVectorBase<const_slang::ast::Expression_*> *)context);
  pSVar5 = local_110;
  if (!bVar6) goto LAB_002b65ed;
  expr = *(Expression **)&local_110->kind;
  ASTContext::eval((ConstantValue *)&local_d0,context,expr,(bitmask<slang::ast::EvalFlags>)0x0);
  if (local_d0._M_index == '\0') {
    if (expr->kind == TypeReference) {
      local_190 = *(Type **)(expr + 1);
      goto LAB_002b62e0;
    }
  }
  else {
    local_190 = (Type *)0x0;
LAB_002b62e0:
    sVar2 = (syntax->items).super_span<slang::syntax::CaseItemSyntax_*,_18446744073709551615UL>.
            _M_extent._M_extent_value;
    if (sVar2 == 0) {
      bVar6 = false;
    }
    else {
      ppSVar12 = &pSVar5->parent;
      ppCVar11 = (syntax->items).super_span<slang::syntax::CaseItemSyntax_*,_18446744073709551615UL>
                 ._M_ptr;
      ppCVar1 = ppCVar11 + sVar2;
      attributes = &(syntax->super_MemberSyntax).attributes;
      bVar6 = false;
      bVar8 = false;
      local_140 = (SourceLocation)0x0;
      local_148 = (SourceLocation)0x0;
      do {
        pCVar3 = *ppCVar11;
        if ((pCVar3->super_SyntaxNode).kind == StandardCaseItem) {
          if (*(long *)&pCVar3[3].super_SyntaxNode + 1U < 2) {
            local_178 = (SourceLocation)0x0;
            local_180 = (SourceLocation)0x0;
            bVar4 = false;
          }
          else {
            bVar4 = false;
            uVar13 = 0;
            local_180 = (SourceLocation)0x0;
            local_178 = (SourceLocation)0x0;
            do {
              expr_00 = (Expression *)*ppSVar12;
              ASTContext::eval((ConstantValue *)&local_58,context,expr_00,
                               (bitmask<slang::ast::EvalFlags>)0x0);
              if (local_58._M_index == '\0') {
                bVar7 = false;
              }
              else {
                bVar7 = slang::operator==((ConstantValue *)&local_58,(ConstantValue *)&local_d0);
              }
              if (((local_58._M_index == '\0') && (local_190 != (Type *)0x0)) &&
                 (expr_00->kind == TypeReference)) {
                bVar7 = Type::isMatching(*(Type **)(expr_00 + 1),local_190);
              }
              if ((!bVar4) && (bVar7 != false)) {
                local_178 = (expr_00->sourceRange).startLoc;
                local_180 = (expr_00->sourceRange).endLoc;
                bVar4 = true;
              }
              ppSVar12 = ppSVar12 + 1;
              std::__detail::__variant::
              _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
              ::~_Variant_storage(&local_58);
              uVar13 = uVar13 + 1;
            } while (uVar13 < *(long *)&pCVar3[3].super_SyntaxNode + 1U >> 1);
          }
          if (bVar4) {
            if (!bVar6) {
              bVar6 = true;
              createCondGenBlock(compilation,*(SyntaxNode **)&pCVar3[4].super_SyntaxNode,context,
                                 constructIndex,isUninstantiated,attributes,results);
              local_148 = local_178;
              local_140 = local_180;
              goto LAB_002b6541;
            }
            if (!bVar8) {
              sourceRange.endLoc = local_180;
              sourceRange.startLoc = local_178;
              pDVar10 = ASTContext::addDiag(context,(DiagCode)0xe80006,sourceRange);
              Diagnostic::operator<<(pDVar10,(ConstantValue *)&local_d0);
              bVar8 = true;
              range.endLoc = local_140;
              range.startLoc = local_148;
              Diagnostic::addNote(pDVar10,(DiagCode)0xb0001,range);
            }
          }
          createCondGenBlock(compilation,*(SyntaxNode **)&pCVar3[4].super_SyntaxNode,context,
                             constructIndex,true,attributes,results);
        }
LAB_002b6541:
        ppCVar11 = ppCVar11 + 1;
      } while (ppCVar11 != ppCVar1);
    }
    if (local_160 == (SyntaxNode *)0x0) {
      if (bVar6 == false) {
        pDVar10 = ASTContext::addDiag(context,(DiagCode)0xe90006,expr->sourceRange);
        Diagnostic::operator<<(pDVar10,(ConstantValue *)&local_d0);
      }
    }
    else {
      createCondGenBlock(compilation,local_160,context,constructIndex,
                         (bool)(isUninstantiated | bVar6),&(syntax->super_MemberSyntax).attributes,
                         results);
    }
  }
  std::__detail::__variant::
  _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  ::~_Variant_storage(&local_d0);
LAB_002b65ed:
  if (local_110 != &local_f8) {
    operator_delete(local_110);
  }
  if (local_98 != &local_80) {
    operator_delete(local_98);
  }
  return;
}

Assistant:

void GenerateBlockSymbol::fromSyntax(Compilation& compilation, const CaseGenerateSyntax& syntax,
                                     const ASTContext& context, uint32_t constructIndex,
                                     bool isUninstantiated,
                                     SmallVectorBase<GenerateBlockSymbol*>& results) {

    SmallVector<const ExpressionSyntax*> expressions;
    const SyntaxNode* defBlock = nullptr;
    for (auto item : syntax.items) {
        switch (item->kind) {
            case SyntaxKind::StandardCaseItem: {
                auto& sci = item->as<StandardCaseItemSyntax>();
                for (auto es : sci.expressions)
                    expressions.push_back(es);
                break;
            }
            case SyntaxKind::DefaultCaseItem:
                // The parser already errored for duplicate defaults,
                // so just ignore if it happens here.
                defBlock = item->as<DefaultCaseItemSyntax>().clause;
                break;
            default:
                SLANG_UNREACHABLE;
        }
    }

    SmallVector<const Expression*> bound;
    if (!Expression::bindMembershipExpressions(
            context, TokenKind::CaseKeyword, /* requireIntegral */ false,
            /* unwrapUnpacked */ false, /* allowTypeReferences */ true, /* allowValueRange */ true,
            *syntax.condition, expressions, bound)) {
        return;
    }

    auto boundIt = bound.begin();
    auto condExpr = *boundIt++;

    const Type* condType = nullptr;
    ConstantValue condVal = context.eval(*condExpr);
    if (!condVal) {
        if (condExpr->kind == ExpressionKind::TypeReference)
            condType = &condExpr->as<TypeReferenceExpression>().targetType;
        else
            return;
    }

    SourceRange matchRange;
    bool found = false;
    bool warned = false;

    for (auto item : syntax.items) {
        if (item->kind != SyntaxKind::StandardCaseItem)
            continue;

        // Check each case expression to see if it matches the condition value.
        bool currentFound = false;
        SourceRange currentMatchRange;
        auto& sci = item->as<StandardCaseItemSyntax>();
        for (size_t i = 0; i < sci.expressions.size(); i++) {
            // Have to keep incrementing the iterator here so that we stay in sync.
            auto expr = *boundIt++;
            ConstantValue val = context.eval(*expr);

            bool match = val && val == condVal;
            if (!val && condType && expr->kind == ExpressionKind::TypeReference)
                match = expr->as<TypeReferenceExpression>().targetType.isMatching(*condType);

            if (!currentFound && match) {
                currentFound = true;
                currentMatchRange = expr->sourceRange;
            }
        }

        if (currentFound && !found) {
            // This is the first match for this entire case generate.
            found = true;
            matchRange = currentMatchRange;
            createCondGenBlock(compilation, *sci.clause, context, constructIndex, isUninstantiated,
                               syntax.attributes, results);
        }
        else {
            // If we previously found a block, this block also matched, which we should warn about.
            if (currentFound && !warned) {
                auto& diag = context.addDiag(diag::CaseGenerateDup, currentMatchRange);
                diag << condVal;
                diag.addNote(diag::NotePreviousMatch, matchRange);
                warned = true;
            }

            // This block is not taken, so create it as uninstantiated.
            createCondGenBlock(compilation, *sci.clause, context, constructIndex, true,
                               syntax.attributes, results);
        }
    }

    if (defBlock) {
        // Only instantiated if no other blocks were instantiated.
        createCondGenBlock(compilation, *defBlock, context, constructIndex,
                           isUninstantiated || found, syntax.attributes, results);
    }
    else if (!found) {
        auto& diag = context.addDiag(diag::CaseGenerateNoBlock, condExpr->sourceRange);
        diag << condVal;
    }
}